

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void Render(GUI *gui)

{
  PFNGLUNIFORM1IPROC p_Var1;
  PFNGLUNIFORMMATRIX4FVPROC p_Var2;
  GLuint GVar3;
  GLint GVar4;
  float proj [16];
  float local_78 [6];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  if (gui->QuadCount != 0) {
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0x302,0x303);
    (*glad_glDisable)(0xb44);
    (*glad_glDisable)(0xb71);
    (*glad_glUseProgram)((gui->Program).Handle);
    (*glad_glBindBuffer)(0x8892,gui->VertexBuffer);
    (*glad_glBufferData)(0x8892,0x80000,gui->VertexArray,0x88e0);
    GVar3 = (*glad_glGetAttribLocation)((gui->Program).Handle,"position");
    (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glBindBuffer)(0x8892,gui->UVBuffer);
    (*glad_glBufferData)(0x8892,0x80000,gui->UVArray,0x88e0);
    GVar3 = (*glad_glGetAttribLocation)((gui->Program).Handle,"uv");
    (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glBindBuffer)(0x8892,gui->ColorBuffer);
    (*glad_glBufferData)(0x8892,0x40000,gui->ColorArray,0x88e0);
    GVar3 = (*glad_glGetAttribLocation)((gui->Program).Handle,"color");
    (*glad_glVertexAttribPointer)(GVar3,4,0x1401,'\x01',4,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glBindBuffer)(0x8893,gui->IndexBuff);
    (*glad_glBufferData)(0x8893,0x60000,gui->IndexArray,0x88e0);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0xde1,gui->AtlasId);
    p_Var1 = glad_glUniform1i;
    GVar4 = (*glad_glGetUniformLocation)((gui->Program).Handle,"atlas");
    (*p_Var1)(GVar4,0);
    p_Var2 = glad_glUniformMatrix4fv;
    local_78[0] = 2.0 / (float)gui->Width;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[4] = 0.0;
    local_78[5] = -2.0 / (float)gui->Height;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0xbf800000;
    uStack_48 = 0x3f800000bf800000;
    local_40 = 0x3f80000000000000;
    GVar4 = (*glad_glGetUniformLocation)((gui->Program).Handle,"proj");
    (*p_Var2)(GVar4,1,'\0',local_78);
    (*glad_glDrawElements)(4,gui->QuadCount * 6,0x1405,(void *)0x0);
    gui->QuadCount = 0;
  }
  return;
}

Assistant:

static void Render(GUI* gui) {
    if (gui->QuadCount == 0) {
        return;
    }

    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    
    glUseProgram(gui->Program.Handle);

    glBindBuffer(GL_ARRAY_BUFFER, gui->VertexBuffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(gui->VertexArray), gui->VertexArray, GL_STREAM_DRAW);
    GLint position_attrib = glGetAttribLocation(gui->Program.Handle, "position");
    glVertexAttribPointer(position_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
    glEnableVertexAttribArray(position_attrib);

    glBindBuffer(GL_ARRAY_BUFFER, gui->UVBuffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(gui->UVArray), gui->UVArray, GL_STREAM_DRAW);
    GLint uv_attrib = glGetAttribLocation(gui->Program.Handle, "uv");
    glVertexAttribPointer(uv_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
    glEnableVertexAttribArray(uv_attrib);

    glBindBuffer(GL_ARRAY_BUFFER, gui->ColorBuffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(gui->ColorArray), gui->ColorArray, GL_STREAM_DRAW);
    GLint color_attrib = glGetAttribLocation(gui->Program.Handle, "color");
    glVertexAttribPointer(color_attrib, 4, GL_UNSIGNED_BYTE, GL_TRUE, 4 * sizeof(uint8_t), 0);
    glEnableVertexAttribArray(color_attrib);

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, gui->IndexBuff);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(gui->IndexArray), gui->IndexArray, GL_STREAM_DRAW);

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, gui->AtlasId);
    glUniform1i(glGetUniformLocation(gui->Program.Handle, "atlas"), 0);

    float proj[16] = {
        2.0f / gui->Width, 0.0f, 0.0f, 0.0f,
        0.0f, -2.0f / gui->Height, 0.0f, 0.0f,
        0.0f, 0.0f, -1.0f, 0.0f,
        -1.0f, 1.0f, 0.0f, 1.0f
    };
    glUniformMatrix4fv(glGetUniformLocation(gui->Program.Handle, "proj"), 1, GL_FALSE, proj);

    glDrawElements(GL_TRIANGLES, gui->QuadCount * 6, GL_UNSIGNED_INT, 0);

    gui->QuadCount = 0;
}